

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O2

int verify_miniscript_wrapper_l(miniscript_node_t *node,miniscript_node_t *parent)

{
  uint32_t uVar1;
  
  uVar1 = verify_miniscript_or_i_property(0x43b901,node->type_properties);
  node->type_properties = uVar1;
  return (uint)(uVar1 != 0) * 2 + -2;
}

Assistant:

static int verify_miniscript_wrapper_l(struct miniscript_node_t *node, struct miniscript_node_t *parent)
{
    (void)parent;
    node->type_properties = verify_miniscript_or_i_property(
        MINISCRIPT_PROPERTY_OP_0, node->type_properties);
    if (!node->type_properties)
        return WALLY_EINVAL;
    return WALLY_OK;
}